

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode cr_chunked_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                        _Bool *peos)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode CVar3;
  CURLcode result;
  chunked_reader *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  *pnread = 0;
  *peos = (*(byte *)((long)pvVar1 + 0x60) >> 1 & 1) != 0;
  if ((*(byte *)((long)pvVar1 + 0x60) >> 1 & 1) == 0) {
    if ((((*(byte *)((long)pvVar1 + 0x60) & 1) == 0) &&
        (_Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x20)), _Var2)) &&
       (CVar3 = add_chunk(data,reader,buf,blen), CVar3 != CURLE_OK)) {
      return CVar3;
    }
    _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x20));
    if (!_Var2) {
      CVar3 = Curl_bufq_cread((bufq *)((long)pvVar1 + 0x20),buf,blen,pnread);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if ((*(byte *)((long)pvVar1 + 0x60) & 1) == 0) {
        return CURLE_OK;
      }
      _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x20));
      if (!_Var2) {
        return CURLE_OK;
      }
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) & 0xfd | 2;
      *peos = true;
      return CURLE_OK;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_chunked_read(struct Curl_easy *data,
                                struct Curl_creader *reader,
                                char *buf, size_t blen,
                                size_t *pnread, bool *peos)
{
  struct chunked_reader *ctx = reader->ctx;
  CURLcode result = CURLE_READ_ERROR;

  *pnread = 0;
  *peos = ctx->eos;

  if(!ctx->eos) {
    if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
      /* Still getting data form the next reader, buffer is empty */
      result = add_chunk(data, reader, buf, blen);
      if(result)
        return result;
    }

    if(!Curl_bufq_is_empty(&ctx->chunkbuf)) {
      result = Curl_bufq_cread(&ctx->chunkbuf, buf, blen, pnread);
      if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->chunkbuf)) {
        /* no more data, read all, done. */
        ctx->eos = TRUE;
        *peos = TRUE;
      }
      return result;
    }
  }
  /* We may get here, because we are done or because callbacks paused */
  DEBUGASSERT(ctx->eos || !ctx->read_eos);
  return CURLE_OK;
}